

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

idx_t duckdb::UncompressedStringStorage::FinalizeAppend
                (ColumnSegment *segment,SegmentStatistics *param_2)

{
  __int_type _Var1;
  BufferManager *pBVar2;
  StringDictionaryContainer SVar3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  ulong __n;
  idx_t iVar6;
  BufferHandle handle;
  CompressionInfo info;
  BufferHandle local_50;
  CompressionInfo local_38;
  
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&local_50,pBVar2,&segment->block);
  SVar3 = GetDictionary(segment,&local_50);
  _Var1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  local_38.block_manager = ColumnSegment::GetBlockManager(segment);
  iVar4 = CompressionInfo::GetCompactionFlushLimit(&local_38);
  __n = (ulong)SVar3 & 0xffffffff;
  iVar6 = __n + _Var1 * 4 + 8;
  if (iVar6 < iVar4) {
    iVar4 = ColumnSegment::SegmentSize(segment);
    pdVar5 = BufferHandle::Ptr(&local_50);
    memmove(pdVar5 + _Var1 * 4 + 8,pdVar5 + (((ulong)SVar3 >> 0x20) - __n),__n);
    SetDictionary(segment,&local_50,
                  (StringDictionaryContainer)
                  ((ulong)((SVar3.end + (int)iVar6) - (int)iVar4) << 0x20 | __n));
  }
  else {
    iVar6 = ColumnSegment::SegmentSize(segment);
  }
  BufferHandle::~BufferHandle(&local_50);
  return iVar6;
}

Assistant:

idx_t UncompressedStringStorage::FinalizeAppend(ColumnSegment &segment, SegmentStatistics &) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto dict = GetDictionary(segment, handle);
	D_ASSERT(dict.end == segment.SegmentSize());
	// compute the total size required to store this segment
	auto offset_size = DICTIONARY_HEADER_SIZE + segment.count * sizeof(int32_t);
	auto total_size = offset_size + dict.size;

	CompressionInfo info(segment.GetBlockManager());
	if (total_size >= info.GetCompactionFlushLimit()) {
		// the block is full enough, don't bother moving around the dictionary
		return segment.SegmentSize();
	}

	// the block has space left: figure out how much space we can save
	auto move_amount = segment.SegmentSize() - total_size;
	// move the dictionary so it lines up exactly with the offsets
	auto dataptr = handle.Ptr();
	memmove(dataptr + offset_size, dataptr + dict.end - dict.size, dict.size);
	dict.end -= move_amount;
	D_ASSERT(dict.end == total_size);
	// write the new dictionary (with the updated "end")
	SetDictionary(segment, handle, dict);
	return total_size;
}